

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O0

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,FieldInvocation *ptr)

{
  value_type pAVar1;
  int iVar2;
  mapped_type *this_00;
  reference ppAVar3;
  ExpressionWrapper *this_01;
  undefined4 extraout_var;
  value_type address;
  FieldInvocation *ptr_local;
  ir_tree_visitor *this_local;
  
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>_>
            ::operator[](&this->addresses,ptr->name);
  ppAVar3 = std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>
            ::top(this_00);
  pAVar1 = *ppAVar3;
  this_01 = (ExpressionWrapper *)operator_new(0x10);
  iVar2 = (*pAVar1->_vptr_Address[2])();
  IRT::ExpressionWrapper::ExpressionWrapper(this_01,(Expression *)CONCAT44(extraout_var,iVar2));
  this->curr_wrapper = (SubtreeWrapper *)this_01;
  return;
}

Assistant:

void ir_tree_visitor::visit(FieldInvocation* ptr) {
    //name

    auto address = addresses[*ptr->name].top();
    curr_wrapper = new IRT::ExpressionWrapper(address->ToExpression());
}